

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyRoomListView.cpp
# Opt level: O0

vector<Room,_std::allocator<Room>_> * __thiscall
EmptyRoomListView::getQueryset(EmptyRoomListView *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  map<int,_Room,_std::less<int>,_std::allocator<std::pair<const_int,_Room>_>_> *pmVar4;
  map<int,_Slot,_std::less<int>,_std::allocator<std::pair<const_int,_Slot>_>_> *this_00;
  DateTime *startTime;
  DateTime *endTime;
  mapped_type *pmVar5;
  reference ppVar6;
  Room *pRVar7;
  bool local_125;
  pair<const_int,_bool> *i_3;
  iterator __end2_3;
  iterator __begin2_3;
  map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> *__range2_3;
  int local_c8;
  int local_c4;
  reference local_c0;
  pair<const_int,_Room> *i_2;
  iterator __end2_2;
  iterator __begin2_2;
  map<int,_Room,_std::less<int>,_std::allocator<std::pair<const_int,_Room>_>_> *__range2_2;
  reference local_98;
  pair<const_int,_Slot> *i_1;
  iterator __end2_1;
  iterator __begin2_1;
  map<int,_Slot,_std::less<int>,_std::allocator<std::pair<const_int,_Slot>_>_> *__range2_1;
  reference local_70;
  pair<const_int,_Room> *i;
  iterator __end2;
  iterator __begin2;
  map<int,_Room,_std::less<int>,_std::allocator<std::pair<const_int,_Room>_>_> *__range2;
  undefined1 local_40 [8];
  map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> roomFlags;
  EmptyRoomListView *this_local;
  
  roomFlags._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::vector<Room,_std::allocator<Room>_>::clear
            (&(this->super_ListView<Room>).super_MultipleObjectMixin<Room>.objects);
  std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::map
            ((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> *)
             local_40);
  bVar1 = DateTime::operator<(&(this->params).start,&(this->params).end);
  if (bVar1) {
    pmVar4 = Model<Room>::all();
    __end2 = std::map<int,_Room,_std::less<int>,_std::allocator<std::pair<const_int,_Room>_>_>::
             begin(pmVar4);
    i = (pair<const_int,_Room> *)
        std::map<int,_Room,_std::less<int>,_std::allocator<std::pair<const_int,_Room>_>_>::end
                  (pmVar4);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&i), bVar1) {
      local_70 = std::_Rb_tree_iterator<std::pair<const_int,_Room>_>::operator*(&__end2);
      __range2_1._4_4_ = Room::getRoomNumber(&local_70->second);
      pmVar5 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
               operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                           *)local_40,(key_type *)((long)&__range2_1 + 4));
      *pmVar5 = true;
      std::_Rb_tree_iterator<std::pair<const_int,_Room>_>::operator++(&__end2);
    }
    this_00 = Model<Slot>::all();
    __end2_1 = std::map<int,_Slot,_std::less<int>,_std::allocator<std::pair<const_int,_Slot>_>_>::
               begin(this_00);
    i_1 = (pair<const_int,_Slot> *)
          std::map<int,_Slot,_std::less<int>,_std::allocator<std::pair<const_int,_Slot>_>_>::end
                    (this_00);
    while (bVar1 = std::operator!=(&__end2_1,(_Self *)&i_1), bVar1) {
      local_98 = std::_Rb_tree_iterator<std::pair<const_int,_Slot>_>::operator*(&__end2_1);
      iVar2 = Slot::getApproved(&local_98->second);
      local_125 = false;
      if (iVar2 == 1) {
        pRVar7 = Slot::getRoom(&local_98->second);
        __range2_2._4_4_ = Room::getRoomNumber(pRVar7);
        pmVar5 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
                 operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                             *)local_40,(key_type *)((long)&__range2_2 + 4));
        local_125 = false;
        if ((*pmVar5 & 1U) != 0) {
          startTime = Slot::getStartTime(&local_98->second);
          endTime = Slot::getEndTime(&local_98->second);
          local_125 = clash(this,startTime,endTime);
        }
      }
      if (local_125 != false) {
        pRVar7 = Slot::getRoom(&local_98->second);
        __range2_2._0_4_ = Room::getRoomNumber(pRVar7);
        pmVar5 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
                 operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                             *)local_40,(key_type *)&__range2_2);
        *pmVar5 = false;
      }
      std::_Rb_tree_iterator<std::pair<const_int,_Slot>_>::operator++(&__end2_1);
    }
    pmVar4 = Model<Room>::all();
    __end2_2 = std::map<int,_Room,_std::less<int>,_std::allocator<std::pair<const_int,_Room>_>_>::
               begin(pmVar4);
    i_2 = (pair<const_int,_Room> *)
          std::map<int,_Room,_std::less<int>,_std::allocator<std::pair<const_int,_Room>_>_>::end
                    (pmVar4);
    while (bVar1 = std::operator!=(&__end2_2,(_Self *)&i_2), bVar1) {
      local_c0 = std::_Rb_tree_iterator<std::pair<const_int,_Room>_>::operator*(&__end2_2);
      iVar2 = (this->params).strength;
      iVar3 = Room::getStrength(&local_c0->second);
      if (iVar3 < iVar2) {
        local_c4 = Room::getRoomNumber(&local_c0->second);
        pmVar5 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
                 operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                             *)local_40,&local_c4);
        *pmVar5 = false;
      }
      if ((((this->params).audio & 1U) != 0) && (bVar1 = Room::hasAudio(&local_c0->second), !bVar1))
      {
        local_c8 = Room::getRoomNumber(&local_c0->second);
        pmVar5 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
                 operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                             *)local_40,&local_c8);
        *pmVar5 = false;
      }
      if ((((this->params).video & 1U) != 0) && (bVar1 = Room::hasVideo(&local_c0->second), !bVar1))
      {
        __range2_3._4_4_ = Room::getRoomNumber(&local_c0->second);
        pmVar5 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
                 operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                             *)local_40,(key_type *)((long)&__range2_3 + 4));
        *pmVar5 = false;
      }
      std::_Rb_tree_iterator<std::pair<const_int,_Room>_>::operator++(&__end2_2);
    }
    __end2_3 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
               begin((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> *
                     )local_40);
    i_3 = (pair<const_int,_bool> *)
          std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::end
                    ((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> *
                     )local_40);
    while (bVar1 = std::operator!=(&__end2_3,(_Self *)&i_3), bVar1) {
      ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_bool>_>::operator*(&__end2_3);
      if ((ppVar6->second & 1U) != 0) {
        pRVar7 = Room::findByRoomNumber(ppVar6->first);
        std::vector<Room,_std::allocator<Room>_>::push_back
                  (&(this->super_ListView<Room>).super_MultipleObjectMixin<Room>.objects,pRVar7);
      }
      std::_Rb_tree_iterator<std::pair<const_int,_bool>_>::operator++(&__end2_3);
    }
  }
  std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::~map
            ((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> *)
             local_40);
  return &(this->super_ListView<Room>).super_MultipleObjectMixin<Room>.objects;
}

Assistant:

vector<Room> &EmptyRoomListView::getQueryset() {
    objects.clear();
    map<int, bool> roomFlags;
    if (params.start < params.end) {
        for (auto &i :Room::all()) {
            roomFlags[i.second.getRoomNumber()] = true;
        }

        for (auto &i : Slot::all()) {
            if (i.second.getApproved()==1 && roomFlags[i.second.getRoom().getRoomNumber()] &&
                clash(i.second.getStartTime(), i.second.getEndTime())) {
                roomFlags[i.second.getRoom().getRoomNumber()] = false;
            }
        }
        for(auto &i: Room::all()){
            if(params.strength>i.second.getStrength())
                roomFlags[i.second.getRoomNumber()]=false;
            if(params.audio && !i.second.hasAudio())
                roomFlags[i.second.getRoomNumber()] = false;
            if(params.video && !i.second.hasVideo())
                roomFlags[i.second.getRoomNumber()] = false;
        }

        for (auto &i : roomFlags) {
            if (i.second) objects.push_back(*Room::findByRoomNumber(i.first));
        }
    }
    return objects;
}